

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::short_level_formatter<spdlog::details::scoped_padder>::format
          (short_level_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  char *__s;
  size_t wrapped_size;
  char *buf_ptr;
  scoped_padder p;
  scoped_padder sStack_48;
  
  __s = *(char **)(level::short_level_names + (long)(int)msg->level * 8);
  wrapped_size = strlen(__s);
  scoped_padder::scoped_padder(&sStack_48,wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + wrapped_size);
  scoped_padder::~scoped_padder(&sStack_48);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        string_view_t level_name{level::to_short_c_str(msg.level)};
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }